

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a64emithelper.cpp
# Opt level: O0

Error __thiscall
asmjit::v1_14::a64::EmitHelper::emitArgMove
          (EmitHelper *this,BaseReg *dst_,TypeId dstTypeId,Operand_ *src_,TypeId srcTypeId,
          char *comment)

{
  undefined8 uVar1;
  Error EVar2;
  TypeId *pTVar3;
  undefined8 *in_RCX;
  Operand_ *o1;
  TypeId in_DL;
  uint *in_RSI;
  long in_RDI;
  byte in_R8B;
  undefined8 in_R9;
  InstId instId_1;
  InstId instId;
  uint32_t x;
  uint32_t srcSize;
  uint32_t dstSize;
  Operand src;
  Reg dst;
  ArchTraits *archTraits;
  Operand_ *in_stack_fffffffffffffb18;
  undefined4 in_stack_fffffffffffffb20;
  undefined1 in_stack_fffffffffffffb24;
  undefined1 in_stack_fffffffffffffb25;
  bool bVar4;
  undefined1 in_stack_fffffffffffffb26;
  undefined1 in_stack_fffffffffffffb27;
  bool bVar5;
  undefined8 in_stack_fffffffffffffb28;
  InstId instId_00;
  undefined1 in_stack_fffffffffffffb30;
  bool bVar6;
  undefined1 in_stack_fffffffffffffb32;
  byte bVar7;
  bool bVar8;
  undefined1 in_stack_fffffffffffffb35;
  byte bVar9;
  bool bVar10;
  undefined4 local_4c0;
  undefined4 local_4bc;
  undefined4 local_4b8;
  undefined4 local_4b4;
  undefined4 local_4b0;
  undefined4 local_4ac;
  undefined4 local_4a8;
  undefined4 local_4a4;
  undefined4 local_4a0;
  uint local_49c;
  uint local_498;
  uint local_494;
  undefined8 local_490;
  undefined8 local_488;
  undefined8 local_480;
  undefined8 local_478;
  undefined1 *local_470;
  undefined8 local_468;
  byte local_459;
  undefined8 *local_458;
  TypeId local_449;
  uint *local_448;
  byte local_434;
  TypeId local_433;
  byte local_432;
  TypeId local_431;
  undefined8 local_430;
  long local_428;
  undefined8 local_420;
  long local_418;
  undefined8 *local_410;
  undefined8 *local_408;
  undefined8 *local_400;
  undefined8 *local_3f8;
  uint *local_3f0;
  uint *local_3e8;
  undefined8 *local_3e0;
  undefined8 *local_3d8;
  undefined8 *local_3d0;
  undefined8 *local_3c8;
  undefined8 *local_3c0;
  byte local_3b1;
  long local_3b0;
  byte local_3a1;
  undefined1 *local_3a0;
  undefined8 *local_390;
  undefined8 *local_388;
  byte local_37c;
  TypeId local_37b;
  byte local_37a;
  TypeId local_379;
  undefined4 *local_378;
  undefined8 *local_370;
  undefined4 *local_368;
  undefined8 *local_360;
  undefined4 *local_358;
  undefined8 *local_350;
  undefined4 *local_348;
  undefined8 *local_340;
  undefined4 *local_338;
  undefined8 *local_330;
  undefined4 *local_328;
  undefined8 *local_320;
  undefined4 *local_318;
  undefined8 *local_310;
  undefined8 *local_308;
  undefined4 local_2fc;
  undefined8 *local_2f8;
  undefined4 local_2ec;
  undefined8 *local_2e8;
  undefined8 *local_2e0;
  undefined4 local_2d4;
  undefined8 local_2d0;
  undefined8 *local_2c8;
  undefined8 *local_2c0;
  undefined4 local_2b4;
  undefined8 local_2b0;
  undefined8 *local_2a8;
  undefined8 *local_2a0;
  undefined4 local_294;
  undefined8 local_290;
  undefined8 *local_288;
  undefined8 *local_280;
  undefined4 local_274;
  undefined8 local_270;
  byte local_264;
  TypeId local_263;
  byte local_262;
  TypeId local_261;
  undefined4 local_260;
  undefined4 local_25c;
  uint local_258;
  undefined1 local_253;
  undefined1 local_252;
  TypeId local_251;
  undefined4 local_250;
  undefined4 local_24c;
  uint local_248;
  undefined1 local_243;
  undefined1 local_242;
  byte local_241;
  undefined4 local_240;
  undefined4 local_23c;
  uint local_238;
  undefined1 local_233;
  undefined1 local_232;
  TypeId local_231;
  undefined4 local_230;
  undefined4 local_22c;
  uint local_228;
  undefined1 local_223;
  undefined1 local_222;
  byte local_221;
  undefined4 local_220;
  undefined4 local_21c;
  uint local_218;
  undefined1 local_213;
  undefined1 local_212;
  TypeId local_211;
  undefined4 local_210;
  undefined4 local_20c;
  uint local_208;
  undefined1 local_203;
  undefined1 local_202;
  byte local_201;
  undefined4 local_200;
  undefined4 local_1fc;
  uint local_1f8;
  undefined1 local_1f3;
  undefined1 local_1f2;
  TypeId local_1f1;
  undefined4 local_1f0;
  undefined4 local_1ec;
  uint local_1e8;
  undefined1 local_1e3;
  undefined1 local_1e2;
  byte local_1e1;
  undefined4 local_1e0;
  undefined4 local_1dc;
  uint local_1d8;
  undefined1 local_1d3;
  undefined1 local_1d2;
  TypeId local_1d1;
  undefined4 local_1d0;
  undefined4 local_1cc;
  uint local_1c8;
  undefined1 local_1c3;
  undefined1 local_1c2;
  byte local_1c1;
  undefined4 *local_1c0;
  undefined4 *local_1b8;
  uint *local_1b0;
  undefined4 *local_1a8;
  undefined4 *local_1a0;
  uint *local_198;
  undefined4 *local_190;
  undefined4 *local_188;
  uint *local_180;
  undefined4 *local_178;
  undefined4 *local_170;
  uint *local_168;
  undefined4 *local_160;
  undefined4 *local_158;
  uint *local_150;
  undefined4 *local_148;
  undefined4 *local_140;
  uint *local_138;
  undefined4 *local_130;
  undefined4 *local_128;
  uint *local_120;
  undefined4 *local_118;
  undefined4 *local_110;
  uint *local_108;
  undefined4 *local_100;
  undefined4 *local_f8;
  char *in_stack_ffffffffffffff10;
  undefined8 in_stack_ffffffffffffff18;
  int line;
  char *in_stack_ffffffffffffff20;
  
  instId_00 = (InstId)((ulong)in_stack_fffffffffffffb28 >> 0x20);
  line = (int)((ulong)in_stack_ffffffffffffff18 >> 0x20);
  local_468 = in_R9;
  local_459 = in_R8B;
  local_458 = in_RCX;
  local_449 = in_DL;
  local_448 = in_RSI;
  if (in_DL == kVoid) {
    local_3b0 = *(long *)(in_RDI + 8);
    local_3b1 = *(byte *)(local_3b0 + 0x48);
    local_470 = _archTraits + (ulong)local_3b1 * 0xd8;
    local_3a1 = (byte)(*in_RSI >> 3) & 0x1f;
    local_3a0 = local_470;
    pTVar3 = Support::Array<asmjit::v1_14::TypeId,_32UL>::operator[]<asmjit::v1_14::RegType>
                       ((Array<asmjit::v1_14::TypeId,_32UL> *)
                        CONCAT17(in_stack_fffffffffffffb27,
                                 CONCAT16(in_stack_fffffffffffffb26,
                                          CONCAT15(in_stack_fffffffffffffb25,
                                                   CONCAT14(in_stack_fffffffffffffb24,
                                                            in_stack_fffffffffffffb20)))),
                        (RegType *)in_stack_fffffffffffffb18);
    local_449 = *pTVar3;
  }
  local_433 = local_449;
  local_1d1 = local_449;
  local_1d2 = 0x20;
  local_1d3 = 100;
  local_1d8 = (uint)local_449;
  local_1dc = 0x20;
  local_1e0 = 100;
  local_198 = &local_1d8;
  local_1a0 = &local_1dc;
  local_1a8 = &local_1e0;
  bVar10 = 0x1f < local_1d8 && local_1d8 < 0x65;
  bVar9 = 0;
  if (bVar10) {
    local_431 = local_449;
    local_1f1 = local_449;
    local_1f2 = 0x20;
    local_1f3 = 0x21;
    local_1f8 = (uint)local_449;
    local_1fc = 0x20;
    local_200 = 0x21;
    local_168 = &local_1f8;
    local_170 = &local_1fc;
    local_178 = &local_200;
    in_stack_fffffffffffffb35 = 0x1f < local_1f8 && local_1f8 < 0x22;
    bVar9 = in_stack_fffffffffffffb35 ^ 0xff;
  }
  if ((bVar9 & 1) == 0) {
    DebugUtils::assertionFailed(in_stack_ffffffffffffff20,line,in_stack_ffffffffffffff10);
  }
  local_434 = local_459;
  local_1c1 = local_459;
  local_1c2 = 0x20;
  local_1c3 = 100;
  local_1c8 = (uint)local_459;
  local_1cc = 0x20;
  local_1d0 = 100;
  local_1b0 = &local_1c8;
  local_1b8 = &local_1cc;
  local_1c0 = &local_1d0;
  bVar8 = 0x1f < local_1c8 && local_1c8 < 0x65;
  bVar7 = 0;
  if (bVar8) {
    local_432 = local_459;
    local_1e1 = local_459;
    local_1e2 = 0x20;
    local_1e3 = 0x21;
    local_1e8 = (uint)local_459;
    local_1ec = 0x20;
    local_1f0 = 0x21;
    local_180 = &local_1e8;
    local_188 = &local_1ec;
    local_190 = &local_1f0;
    in_stack_fffffffffffffb32 = 0x1f < local_1e8 && local_1e8 < 0x22;
    bVar7 = in_stack_fffffffffffffb32 ^ 0xff;
  }
  if ((bVar7 & 1) == 0) {
    DebugUtils::assertionFailed(in_stack_ffffffffffffff20,line,in_stack_ffffffffffffff10);
  }
  local_3f0 = local_448;
  local_3e0 = &local_480;
  local_3e8 = local_448;
  local_480 = *(undefined8 *)local_448;
  local_478 = *(undefined8 *)(local_448 + 2);
  local_388 = &local_490;
  local_390 = local_458;
  uVar1 = *local_458;
  local_488 = local_458[1];
  local_37b = local_449;
  local_494 = (uint)(byte)TypeUtils::_typeData[(ulong)local_449 + 0x100];
  local_37c = local_459;
  local_498 = (uint)(byte)TypeUtils::_typeData[(ulong)local_459 + 0x100];
  local_379 = local_449;
  local_211 = local_449;
  local_212 = 0x20;
  local_213 = 0x29;
  local_218 = (uint)local_449;
  local_21c = 0x20;
  local_220 = 0x29;
  local_138 = &local_218;
  local_140 = &local_21c;
  local_148 = &local_220;
  bVar6 = 0x1f < local_218 && local_218 < 0x2a;
  local_490._4_4_ = (undefined4)((ulong)uVar1 >> 0x20);
  local_490._0_4_ = (uint)uVar1;
  local_490 = uVar1;
  if (bVar6) {
    local_37a = local_459;
    local_201 = local_459;
    local_202 = 0x20;
    local_203 = 0x29;
    local_208 = (uint)local_459;
    local_20c = 0x20;
    local_210 = 0x29;
    local_150 = &local_208;
    local_158 = &local_20c;
    local_160 = &local_210;
    in_stack_fffffffffffffb30 = 0x1f < local_208 && local_208 < 0x2a;
    if ((bool)in_stack_fffffffffffffb30) {
      local_49c = (uint)(local_494 == 8);
      local_4a4 = 0x4000031;
      if (local_49c != 0) {
        local_4a4 = 0x8000039;
      }
      local_310 = &local_480;
      local_318 = &local_4a0;
      local_480._4_4_ = (undefined4)((ulong)local_480 >> 0x20);
      local_480 = CONCAT44(local_480._4_4_,local_4a4);
      local_418 = *(long *)(in_RDI + 8);
      local_420 = local_468;
      *(undefined8 *)(local_418 + 0x60) = local_468;
      local_408 = &local_490;
      local_4a0 = local_4a4;
      if (((uint)local_490 & 7) == 1) {
        local_2f8 = &local_480;
        local_320 = &local_490;
        local_328 = &local_4a4;
        local_490 = CONCAT44(local_490._4_4_,local_4a4);
        local_270 = *(undefined8 *)(in_RDI + 8);
        local_274 = 0xf4;
        local_280 = &local_480;
        local_288 = &local_490;
        local_2ec = local_4a4;
        EVar2 = BaseEmitter::_emitI((BaseEmitter *)
                                    CONCAT17(bVar10,CONCAT16(bVar9,CONCAT15(
                                                  in_stack_fffffffffffffb35,
                                                  CONCAT14(bVar8,CONCAT13(bVar7,CONCAT12(
                                                  in_stack_fffffffffffffb32,
                                                  CONCAT11(bVar6,in_stack_fffffffffffffb30))))))),
                                    instId_00,
                                    (Operand_ *)
                                    CONCAT17(in_stack_fffffffffffffb27,
                                             CONCAT16(in_stack_fffffffffffffb26,
                                                      CONCAT15(in_stack_fffffffffffffb25,
                                                               CONCAT14(in_stack_fffffffffffffb24,
                                                                        in_stack_fffffffffffffb20)))
                                            ),in_stack_fffffffffffffb18);
        return EVar2;
      }
      local_3f8 = &local_490;
      if (((uint)local_490 & 7) == 2) {
        local_4a8 = 0;
        switch(local_459) {
        case 0x22:
          local_4a8 = 0x9f;
          break;
        case 0x23:
          local_4a8 = 0x9d;
          break;
        case 0x24:
          local_4a8 = 0xa0;
          break;
        case 0x25:
          local_4a8 = 0x9e;
          break;
        case 0x26:
          local_4a8 = 0x9a;
          if (local_49c != 0) {
            local_4a8 = 0xa1;
          }
          break;
        case 0x27:
          local_4a8 = 0x9a;
          break;
        case 0x28:
          local_4a8 = 0x9a;
          break;
        case 0x29:
          local_4a8 = 0x9a;
          break;
        default:
          EVar2 = DebugUtils::errored(3);
          return EVar2;
        }
        local_290 = *(undefined8 *)(in_RDI + 8);
        local_294 = local_4a8;
        local_2a0 = &local_480;
        local_2a8 = &local_490;
        EVar2 = BaseEmitter::_emitI((BaseEmitter *)
                                    CONCAT17(bVar10,CONCAT16(bVar9,CONCAT15(
                                                  in_stack_fffffffffffffb35,
                                                  CONCAT14(bVar8,CONCAT13(bVar7,CONCAT12(
                                                  in_stack_fffffffffffffb32,
                                                  CONCAT11(bVar6,in_stack_fffffffffffffb30))))))),0,
                                    (Operand_ *)
                                    CONCAT17(in_stack_fffffffffffffb27,
                                             CONCAT16(in_stack_fffffffffffffb26,
                                                      CONCAT15(in_stack_fffffffffffffb25,
                                                               CONCAT14(in_stack_fffffffffffffb24,
                                                                        in_stack_fffffffffffffb20)))
                                            ),in_stack_fffffffffffffb18);
        return EVar2;
      }
    }
  }
  local_263 = local_449;
  local_231 = local_449;
  local_232 = 0x2a;
  local_233 = 0x2c;
  local_238 = (uint)local_449;
  local_23c = 0x2a;
  local_240 = 0x2c;
  local_108 = &local_238;
  local_110 = &local_23c;
  local_118 = &local_240;
  bVar5 = 0x29 < local_238 && local_238 < 0x2d;
  if (0x29 >= local_238 || local_238 >= 0x2d) {
    local_261 = local_449;
    local_251 = local_449;
    local_252 = 0x33;
    local_253 = 100;
    local_258 = (uint)local_449;
    local_25c = 0x33;
    local_260 = 100;
    in_stack_fffffffffffffb26 = 0x32 < local_258 && local_258 < 0x65;
    if (0x32 >= local_258 || local_258 >= 0x65) goto LAB_0018ff93;
  }
  local_264 = local_459;
  local_221 = local_459;
  local_222 = 0x2a;
  local_223 = 0x2c;
  local_228 = (uint)local_459;
  local_22c = 0x2a;
  local_230 = 0x2c;
  local_120 = &local_228;
  local_128 = &local_22c;
  local_130 = &local_230;
  bVar4 = 0x29 < local_228 && local_228 < 0x2d;
  if (0x29 >= local_228 || local_228 >= 0x2d) {
    local_262 = local_459;
    local_241 = local_459;
    local_242 = 0x33;
    local_243 = 100;
    local_248 = (uint)local_459;
    local_24c = 0x33;
    local_250 = 100;
    local_f8 = &local_24c;
    local_100 = &local_250;
    in_stack_fffffffffffffb24 = 0x32 < local_248 && local_248 < 0x65;
    if (0x32 >= local_248 || local_248 >= 0x65) goto LAB_0018ff93;
  }
  o1 = (Operand_ *)(ulong)(local_498 - 2);
  switch(o1) {
  case (Operand_ *)0x0:
    local_3c0 = &local_480;
    local_4ac = 0x2000149;
    local_338 = &local_4ac;
    local_480 = CONCAT44(local_480._4_4_,0x2000149);
    local_330 = local_3c0;
    break;
  default:
    EVar2 = DebugUtils::errored(3);
    return EVar2;
  case (Operand_ *)0x2:
    local_3c8 = &local_480;
    local_4b0 = 0x4000151;
    local_348 = &local_4b0;
    local_480 = CONCAT44(local_480._4_4_,0x4000151);
    local_340 = local_3c8;
    break;
  case (Operand_ *)0x6:
    local_3d0 = &local_480;
    local_4b4 = 0x8000159;
    local_358 = &local_4b4;
    local_480 = CONCAT44(local_480._4_4_,0x8000159);
    local_350 = local_3d0;
    break;
  case (Operand_ *)0xe:
    local_3d8 = &local_480;
    local_4b8 = 0x10000161;
    local_368 = &local_4b8;
    local_480 = CONCAT44(local_480._4_4_,0x10000161);
    local_360 = local_3d8;
  }
  local_428 = *(long *)(in_RDI + 8);
  local_430 = local_468;
  *(undefined8 *)(local_428 + 0x60) = local_468;
  local_410 = &local_490;
  if (((uint)local_490 & 7) == 1) {
    local_4bc = 0x228;
    if (local_498 < 5) {
      local_4bc = 0x1ff;
    }
    local_308 = &local_480;
    local_4c0 = (undefined4)local_480;
    local_370 = &local_490;
    local_378 = &local_4c0;
    local_490 = CONCAT44(local_490._4_4_,(undefined4)local_480);
    local_2b0 = *(undefined8 *)(in_RDI + 8);
    local_2c0 = &local_480;
    local_2c8 = &local_490;
    local_2fc = local_4c0;
    local_2b4 = local_4bc;
    EVar2 = BaseEmitter::_emitI((BaseEmitter *)
                                CONCAT17(bVar10,CONCAT16(bVar9,CONCAT15(in_stack_fffffffffffffb35,
                                                                        CONCAT14(bVar8,CONCAT13(
                                                  bVar7,CONCAT12(in_stack_fffffffffffffb32,
                                                                 CONCAT11(bVar6,
                                                  in_stack_fffffffffffffb30))))))),instId_00,
                                (Operand_ *)
                                CONCAT17(bVar5,CONCAT16(in_stack_fffffffffffffb26,
                                                        CONCAT15(bVar4,CONCAT14(
                                                  in_stack_fffffffffffffb24,
                                                  in_stack_fffffffffffffb20)))),o1);
    return EVar2;
  }
  local_400 = &local_490;
  if (((uint)local_490 & 7) == 2) {
    local_2d0 = *(undefined8 *)(in_RDI + 8);
    local_2d4 = 0x224;
    local_2e0 = &local_480;
    local_2e8 = &local_490;
    EVar2 = BaseEmitter::_emitI((BaseEmitter *)
                                CONCAT17(bVar10,CONCAT16(bVar9,CONCAT15(in_stack_fffffffffffffb35,
                                                                        CONCAT14(bVar8,CONCAT13(
                                                  bVar7,CONCAT12(in_stack_fffffffffffffb32,
                                                                 CONCAT11(bVar6,
                                                  in_stack_fffffffffffffb30))))))),instId_00,
                                (Operand_ *)
                                CONCAT17(bVar5,CONCAT16(in_stack_fffffffffffffb26,
                                                        CONCAT15(bVar4,CONCAT14(
                                                  in_stack_fffffffffffffb24,
                                                  in_stack_fffffffffffffb20)))),o1);
    return EVar2;
  }
LAB_0018ff93:
  EVar2 = DebugUtils::errored(3);
  return EVar2;
}

Assistant:

Error EmitHelper::emitArgMove(
  const BaseReg& dst_, TypeId dstTypeId,
  const Operand_& src_, TypeId srcTypeId, const char* comment) {

  // Deduce optional `dstTypeId`, which may be `TypeId::kVoid` in some cases.
  if (dstTypeId == TypeId::kVoid) {
    const ArchTraits& archTraits = ArchTraits::byArch(_emitter->arch());
    dstTypeId = archTraits.regTypeToTypeId(dst_.type());
  }

  // Invalid or abstract TypeIds are not allowed.
  ASMJIT_ASSERT(TypeUtils::isValid(dstTypeId) && !TypeUtils::isAbstract(dstTypeId));
  ASMJIT_ASSERT(TypeUtils::isValid(srcTypeId) && !TypeUtils::isAbstract(srcTypeId));

  Reg dst(dst_.as<Reg>());
  Operand src(src_);

  uint32_t dstSize = TypeUtils::sizeOf(dstTypeId);
  uint32_t srcSize = TypeUtils::sizeOf(srcTypeId);

  if (TypeUtils::isInt(dstTypeId)) {
    if (TypeUtils::isInt(srcTypeId)) {
      uint32_t x = uint32_t(dstSize == 8);

      dst.setSignature(OperandSignature{x ? uint32_t(GpX::kSignature) : uint32_t(GpW::kSignature)});
      _emitter->setInlineComment(comment);

      if (src.isReg()) {
        src.setSignature(dst.signature());
        return _emitter->emit(Inst::kIdMov, dst, src);
      }
      else if (src.isMem()) {
        InstId instId = Inst::kIdNone;
          switch (srcTypeId) {
          case TypeId::kInt8: instId = Inst::kIdLdrsb; break;
          case TypeId::kUInt8: instId = Inst::kIdLdrb; break;
          case TypeId::kInt16: instId = Inst::kIdLdrsh; break;
          case TypeId::kUInt16: instId = Inst::kIdLdrh; break;
          case TypeId::kInt32: instId = x ? Inst::kIdLdrsw : Inst::kIdLdr; break;
          case TypeId::kUInt32: instId = Inst::kIdLdr; break;
          case TypeId::kInt64: instId = Inst::kIdLdr; break;
          case TypeId::kUInt64: instId = Inst::kIdLdr; break;
          default:
            return DebugUtils::errored(kErrorInvalidState);
        }
        return _emitter->emit(instId, dst, src);
      }
    }
  }

  if (TypeUtils::isFloat(dstTypeId) || TypeUtils::isVec(dstTypeId)) {
    if (TypeUtils::isFloat(srcTypeId) || TypeUtils::isVec(srcTypeId)) {
      switch (srcSize) {
        case 2: dst.as<Vec>().setSignature(OperandSignature{VecH::kSignature}); break;
        case 4: dst.as<Vec>().setSignature(OperandSignature{VecS::kSignature}); break;
        case 8: dst.as<Vec>().setSignature(OperandSignature{VecD::kSignature}); break;
        case 16: dst.as<Vec>().setSignature(OperandSignature{VecV::kSignature}); break;
        default:
          return DebugUtils::errored(kErrorInvalidState);
      }

      _emitter->setInlineComment(comment);

      if (src.isReg()) {
        InstId instId = srcSize <= 4 ? Inst::kIdFmov_v : Inst::kIdMov_v;
        src.setSignature(dst.signature());
        return _emitter->emit(instId, dst, src);
      }
      else if (src.isMem()) {
        return _emitter->emit(Inst::kIdLdr_v, dst, src);
      }
    }
  }

  return DebugUtils::errored(kErrorInvalidState);
}